

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::MethodDescriptorProto::Swap
          (MethodDescriptorProto *this,MethodDescriptorProto *other)

{
  MethodDescriptorProto *other_local;
  MethodDescriptorProto *this_local;
  
  if (other != this) {
    std::swap<std::__cxx11::string*>(&this->name_,&other->name_);
    std::swap<std::__cxx11::string*>(&this->input_type_,&other->input_type_);
    std::swap<std::__cxx11::string*>(&this->output_type_,&other->output_type_);
    std::swap<google::protobuf::MethodOptions*>(&this->options_,&other->options_);
    std::swap<unsigned_int>(this->_has_bits_,other->_has_bits_);
    UnknownFieldSet::Swap(&this->_unknown_fields_,&other->_unknown_fields_);
    std::swap<int>(&this->_cached_size_,&other->_cached_size_);
  }
  return;
}

Assistant:

void MethodDescriptorProto::Swap(MethodDescriptorProto* other) {
  if (other != this) {
    std::swap(name_, other->name_);
    std::swap(input_type_, other->input_type_);
    std::swap(output_type_, other->output_type_);
    std::swap(options_, other->options_);
    std::swap(_has_bits_[0], other->_has_bits_[0]);
    _unknown_fields_.Swap(&other->_unknown_fields_);
    std::swap(_cached_size_, other->_cached_size_);
  }
}